

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O0

WaveHeader * cinemo::wh::parseWaveHeader(string *file)

{
  int iVar1;
  header_pos dp;
  header_pos dp_00;
  header_pos dp_01;
  header_pos dp_02;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  WaveHeader *this;
  streamoff sVar5;
  streamoff sVar6;
  header_pos local_418;
  header_pos local_410;
  header_pos local_408;
  header_pos local_400;
  undefined1 local_3f8 [16];
  size_t local_3e8;
  size_t read;
  header_pos List;
  header_pos data;
  header_pos fact;
  header_pos fmt;
  long posBeforeHeaderSearch;
  string local_3a0 [39];
  allocator local_379;
  string local_378 [32];
  char local_358 [8];
  char buff [256];
  undefined1 local_250 [16];
  long local_240;
  long fSize;
  WaveHeader *local_228;
  WaveHeader *wh;
  ifstream f;
  string *file_local;
  
  _Var4 = std::operator|(_S_in,_S_bin);
  _Var4 = std::operator|(_Var4,_S_ate);
  std::ifstream::ifstream(&wh,(string *)file,_Var4);
  this = (WaveHeader *)operator_new(0xa8);
  WaveHeader::WaveHeader(this);
  local_228 = this;
  bVar2 = std::ios::operator!((ios *)((long)&wh + *(long *)&wh[-1].FactSampleLength));
  if (((bVar2 & 1) == 0) && (bVar2 = std::ios::good(), (bVar2 & 1) != 0)) {
    local_250 = std::istream::tellg();
    local_240 = std::fpos::operator_cast_to_long((fpos *)local_250);
    std::__cxx11::string::operator=((string *)local_228,(string *)file);
    local_228->FileSize = (uint32_t)local_240;
    if (local_240 < 0x2c) {
      std::ifstream::close();
      std::bitset<8UL>::set(&local_228->ErrorFlags,1,true);
      file_local = &local_228->File;
    }
    else {
      std::ios::clear((long)&wh + *(long *)&wh[-1].FactSampleLength,0);
      std::istream::seekg((long)&wh,_S_beg);
      std::istream::read((char *)&wh,(long)local_358);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_378,local_358,4,&local_379);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_378,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              WaveRIFFString_abi_cxx11_);
      std::__cxx11::string::~string(local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      if (bVar3) {
        std::ifstream::close();
        std::bitset<8UL>::set(&local_228->ErrorFlags,2,true);
        file_local = &local_228->File;
      }
      else {
        std::istream::read((char *)&wh,(long)&local_228->RiffSize);
        if (local_228->FileSize - local_228->RiffSize != 8) {
          std::bitset<8UL>::set(&local_228->WarningFlags,0,true);
        }
        std::istream::read((char *)&wh,(long)local_358);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3a0,local_358,4,(allocator *)((long)&posBeforeHeaderSearch + 7));
        std::__cxx11::string::operator=((string *)&local_228->WaveId,local_3a0);
        std::__cxx11::string::~string(local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&posBeforeHeaderSearch + 7));
        bVar3 = std::operator!=(&local_228->WaveId,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )WaveWaveIdString_abi_cxx11_);
        if (bVar3) {
          std::bitset<8UL>::set(&local_228->ErrorFlags,3,true);
          file_local = &local_228->File;
        }
        else {
          fmt = (header_pos)std::istream::tellg();
          sVar5 = std::fpos::operator_cast_to_long((fpos *)&fmt);
          std::pair<bool,_int>::pair<bool,_int,_true>(&fact);
          std::pair<bool,_int>::pair<bool,_int,_true>(&data);
          std::pair<bool,_int>::pair<bool,_int,_true>(&List);
          std::pair<bool,_int>::pair<bool,_int,_true>((pair<bool,_int> *)&read);
          std::istream::read((char *)&wh,(long)local_358);
          local_3f8 = std::istream::tellg();
          sVar6 = std::fpos::operator_cast_to_long((fpos *)local_3f8);
          local_3e8 = sVar6 - sVar5;
          local_400 = searchForHeader(local_358,local_3e8,(string *)WaveFormatString_abi_cxx11_);
          std::pair<bool,_int>::operator=(&fact,&local_400);
          local_408 = searchForHeader(local_358,local_3e8,(string *)WaveFactString_abi_cxx11_);
          std::pair<bool,_int>::operator=(&data,&local_408);
          local_410 = searchForHeader(local_358,local_3e8,(string *)WaveDataString_abi_cxx11_);
          std::pair<bool,_int>::operator=(&List,&local_410);
          local_418 = searchForHeader(local_358,local_3e8,(string *)WaveListString_abi_cxx11_);
          std::pair<bool,_int>::operator=((pair<bool,_int> *)&read,&local_418);
          if ((fact._0_4_ & 1) == 0) {
            std::bitset<8UL>::set(&local_228->ErrorFlags,4,true);
          }
          if ((List._0_4_ & 1) == 0) {
            std::bitset<8UL>::set(&local_228->ErrorFlags,5,true);
          }
          bVar3 = std::bitset<8UL>::any(&local_228->ErrorFlags);
          if (bVar3) {
            std::ifstream::close();
            file_local = &local_228->File;
          }
          else {
            iVar1 = (int)sVar5 + 4;
            if (((data._0_4_ & 1) != 0) || (((byte)read & 1) != 0)) {
              std::bitset<8UL>::set(&local_228->WarningFlags,1,true);
            }
            if ((data._0_4_ & 1) != 0) {
              data.second = data.second + iVar1;
              local_228->HasFact = true;
            }
            if ((fact._0_4_ & 1) != 0) {
              fact.second = fact.second + iVar1;
              dp_02.second = fact.second;
              dp_02.first = fact.first;
              dp_02._1_3_ = fact._1_3_;
              getFmtFromFileHandle(local_228,(ifstream *)&wh,dp_02);
            }
            if ((data._0_4_ & 1) != 0) {
              dp_01.second = data.second;
              dp_01.first = data.first;
              dp_01._1_3_ = data._1_3_;
              getFactFromFileHandle(local_228,(ifstream *)&wh,dp_01);
            }
            if ((List._0_4_ & 1) != 0) {
              List.second = List.second + iVar1;
              dp_00.second = List.second;
              dp_00.first = List.first;
              dp_00._1_3_ = List._1_3_;
              getDataFromFileHandle(local_228,(ifstream *)&wh,dp_00);
            }
            if (((byte)read & 1) != 0) {
              local_228->hasList = true;
              dp._1_7_ = read._1_7_;
              dp.first = (bool)(byte)read;
              getListInfoFromFileHandle(local_228,(ifstream *)&wh,dp);
            }
            std::ifstream::close();
            file_local = &local_228->File;
          }
        }
      }
    }
  }
  else {
    std::bitset<8UL>::set(&local_228->ErrorFlags,0,true);
    file_local = &local_228->File;
  }
  fSize._0_4_ = 1;
  local_228 = (WaveHeader *)file_local;
  std::ifstream::~ifstream(&wh);
  return (WaveHeader *)file_local;
}

Assistant:

WaveHeader* parseWaveHeader(const string& file) {

            std::ifstream f(file, std::ios::in | std::ios::binary |
                                  std::ios::ate);

            WaveHeader* const wh = new WaveHeader;

            if (!f || !f.good()) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileIo), 1);
                return wh;
            }

            //Check for file size requirements
            long fSize = f.tellg(); //file is opened at the end
            wh->File = file;
            wh->FileSize = static_cast<uint32_t>(fSize);

            if (fSize < WaveMinLength) {
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_FileTooSmall), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //reset file handle (rewind)
            f.clear();
            f.seekg(0, std::ios::beg);

            char buff[WaveBufferSize]; //buffer for read operations

            //Check if file is RIFF
            f.read(&buff[0], 4); //get first 4 bytes
            if (string(&buff[0], 4) != WaveRIFFString) { //not valid
                f.close();
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoRiffChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //RIFF Size (which should be (total file size - 8)
            //otherwise file might be corrupt
            f.read(reinterpret_cast<char*>(&wh->RiffSize), 4);
            if (wh->FileSize - wh->RiffSize != 8) {
                wh->WarningFlags.set(WARNING_SizeMismatch, 1); //just a warning
            }

            //extract "WAVE"
            f.read(&buff[0], 4);
            wh->WaveId = string(&buff[0], 4);
            if (wh->WaveId != WaveWaveIdString) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoWaveChunk), 1);
                return wh; //because there is no point in reading rest of the file
            }

            //next might be "fmt " but there is no guarantee!
            long posBeforeHeaderSearch = static_cast<long>(f.tellg());
            header_pos fmt, fact, data, List;
            f.read(&buff[0], WaveBufferSize);
            size_t read = static_cast<size_t>(static_cast<long>(f.tellg()) -
                                              posBeforeHeaderSearch);
            //for fmt and fact there is no guranatee which comes first
            //so the search function is called twice
            fmt = searchForHeader(buff, read, WaveFormatString);
            fact = searchForHeader(buff, read, WaveFactString);
            //TODO search for data within fmt or fact search to speed up!
            data = searchForHeader(buff, read, WaveDataString);
            List = searchForHeader(buff, read, WaveListString);

            //fmt and data SHOULD be available, otherwise file is corrupted
            //fact is optional
            if (!fmt.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoFmtChunk), 1);
            }

            if (!data.first) {
                wh->ErrorFlags.set(static_cast<int>(ERROR_NoDataChunk), 1);
            }

            if (wh->ErrorFlags.any()) {
                f.close();
                return wh; //to much errors! no point in reading rest of the file
            }

            posBeforeHeaderSearch += 4; //since all headers are 4 byte

            if (fact.first || List.first) {
                wh->WarningFlags.set(
                        static_cast<int>(WARNING_NoneStandardExtension), 1);
            }

            if (fact.first) {
                fact.second += posBeforeHeaderSearch;
                wh->HasFact = true; //set the flag
                //fact should be parsed after fmt
            }

            if (fmt.first) {
                fmt.second += posBeforeHeaderSearch;
                getFmtFromFileHandle(wh, f, fmt);
            }

            if (fact.first) {
                getFactFromFileHandle(wh, f, fact);
            }

            if (data.first) {
                data.second += posBeforeHeaderSearch;
                getDataFromFileHandle(wh, f, data);
            }

            if (List.first) {
                wh->hasList = true;
                getListInfoFromFileHandle(wh, f, List);
            }

            f.close();
            return wh;
        }